

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall
flatbuffers::ts::TsGenerator::GenObjApi
          (TsGenerator *this,Parser *parser,StructDef *struct_def,string *obj_api_unpack_func,
          string *obj_api_class,import_set *imports)

{
  BaseType BVar1;
  FieldDef *field;
  IDLOptions *pIVar2;
  StructDef *pSVar3;
  bool bVar4;
  IdlNamer *this_00;
  char *pcVar5;
  pointer ppFVar6;
  Type *__return_storage_ptr__;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  EnumDef *union_enum;
  EnumDef *union_type;
  bool local_511;
  string local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  Type vectortype;
  string field_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string field_field;
  string vectortypename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string field_val;
  allocator<char> local_321;
  string field_type;
  string field_method;
  string field_binded_method;
  string field_offset_decl;
  string constructor_func;
  string field_accessor;
  string local_1b0;
  string pack_func_create_call;
  string field_offset_val;
  allocator<char> local_148 [32];
  string unpack_to_func;
  string struct_name;
  string pack_func_prototype;
  string pack_func_offset_decl;
  string unpack_func;
  string class_name;
  string field_default_val;
  
  union_enum = (EnumDef *)imports;
  GetTypeName_abi_cxx11_(&class_name,this,struct_def,true,false);
  std::operator+(&pack_func_prototype,"\nunpack(): ",&class_name);
  std::operator+(&constructor_func,&pack_func_prototype," {\n  return new ");
  std::operator+(&unpack_to_func,&constructor_func,&class_name);
  std::operator+(&field_accessor,&unpack_to_func,"(");
  pcVar5 = "\n";
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar5 = "";
  }
  std::operator+(&unpack_func,&field_accessor,pcVar5);
  std::__cxx11::string::~string((string *)&field_accessor);
  std::__cxx11::string::~string((string *)&unpack_to_func);
  std::__cxx11::string::~string((string *)&constructor_func);
  std::__cxx11::string::~string((string *)&pack_func_prototype);
  std::operator+(&constructor_func,"\nunpackTo(_o: ",&class_name);
  std::operator+(&field_accessor,&constructor_func,"): void {");
  pcVar5 = "\n";
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar5 = "";
  }
  std::operator+(&unpack_to_func,&field_accessor,pcVar5);
  std::__cxx11::string::~string((string *)&field_accessor);
  std::__cxx11::string::~string((string *)&constructor_func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&constructor_func,"constructor(",(allocator<char> *)&field_accessor);
  std::__cxx11::string::append((char *)&constructor_func);
  local_511 = true;
  if (struct_def->fixed == false) {
    local_511 = CanCreateFactoryMethod(struct_def);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pack_func_prototype,
             "\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n",
             (allocator<char> *)&field_accessor);
  pack_func_offset_decl._M_dataplus._M_p = (pointer)&pack_func_offset_decl.field_2;
  pack_func_offset_decl._M_string_length = 0;
  pack_func_offset_decl.field_2._M_local_buf[0] = '\0';
  pack_func_create_call._M_dataplus._M_p = (pointer)&pack_func_create_call.field_2;
  pack_func_create_call._M_string_length = 0;
  pack_func_create_call.field_2._M_local_buf[0] = '\0';
  AddImport<flatbuffers::StructDef>
            ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
             struct_def);
  struct_name._M_dataplus._M_p = (pointer)&struct_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_accessor._M_dataplus._M_p == &field_accessor.field_2) {
    struct_name.field_2._8_8_ = field_accessor.field_2._8_8_;
  }
  else {
    struct_name._M_dataplus = field_accessor._M_dataplus;
  }
  struct_name._M_string_length = field_accessor._M_string_length;
  field_accessor._M_string_length = 0;
  field_accessor.field_2._M_local_buf[0] = '\0';
  field_accessor._M_dataplus._M_p = (pointer)&field_accessor.field_2;
  anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&field_accessor);
  if (local_511 == false) {
    std::operator+(&field_binded_method,"  ",&struct_name);
    std::operator+(&field_field,&field_binded_method,".start");
    std::operator+(&field_val,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&field_method,&field_field,&field_val);
    std::operator+(&field_accessor,&field_method,"(builder);\n");
    std::__cxx11::string::operator=((string *)&pack_func_create_call,(string *)&field_accessor);
    std::__cxx11::string::~string((string *)&field_accessor);
    std::__cxx11::string::~string((string *)&field_method);
    std::__cxx11::string::~string((string *)&field_val);
    std::__cxx11::string::~string((string *)&field_field);
    psVar7 = &field_binded_method;
  }
  else {
    std::operator+(&field_val,"  return ",&struct_name);
    std::operator+(&field_binded_method,&field_val,".create");
    std::operator+(&field_type,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&field_field,&field_binded_method,&field_type);
    std::operator+(&field_method,&field_field,"(builder");
    pcVar5 = ",\n    ";
    if ((struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pcVar5 = "";
    }
    std::operator+(&field_accessor,&field_method,pcVar5);
    std::__cxx11::string::operator=((string *)&pack_func_create_call,(string *)&field_accessor);
    std::__cxx11::string::~string((string *)&field_accessor);
    std::__cxx11::string::~string((string *)&field_method);
    std::__cxx11::string::~string((string *)&field_field);
    std::__cxx11::string::~string((string *)&field_type);
    std::__cxx11::string::~string((string *)&field_binded_method);
    psVar7 = &field_val;
  }
  std::__cxx11::string::~string((string *)psVar7);
  if (struct_def->fixed == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&field_field,"this",(allocator<char> *)&field_val);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&field_binded_method,",\n    ",(allocator<char> *)&field_type);
    union_enum = (EnumDef *)0x0;
    GenStructMemberValueTS(&field_method,this,struct_def,&field_field,&field_binded_method,false);
    std::operator+(&field_accessor,&field_method,"\n  ");
    std::__cxx11::string::append((string *)&pack_func_create_call);
    std::__cxx11::string::~string((string *)&field_accessor);
    std::__cxx11::string::~string((string *)&field_method);
    std::__cxx11::string::~string((string *)&field_binded_method);
    std::__cxx11::string::~string((string *)&field_field);
  }
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->namer_;
  do {
    if (ppFVar6 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&constructor_func);
      if (local_511 == false) {
        std::operator+(&field_binded_method,"return ",&struct_name);
        std::operator+(&field_field,&field_binded_method,".end");
        std::operator+(&field_val,"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::operator+(&field_method,&field_field,&field_val);
        std::operator+(&field_accessor,&field_method,"(builder);");
        std::__cxx11::string::append((string *)&pack_func_create_call);
        std::__cxx11::string::~string((string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_method);
        std::__cxx11::string::~string((string *)&field_val);
        std::__cxx11::string::~string((string *)&field_field);
        std::__cxx11::string::~string((string *)&field_binded_method);
      }
      else {
        std::__cxx11::string::append((char *)&pack_func_create_call);
      }
      std::__cxx11::string::assign((char *)obj_api_class);
      std::__cxx11::string::append((char *)obj_api_class);
      GetTypeName_abi_cxx11_(&field_accessor,this,struct_def,true,false);
      std::__cxx11::string::append((string *)obj_api_class);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::__cxx11::string::append((char *)obj_api_class);
      std::__cxx11::string::append((string *)obj_api_class);
      std::operator+(&field_field,&pack_func_prototype,&pack_func_offset_decl);
      std::operator+(&field_method,&field_field,&pack_func_create_call);
      std::operator+(&field_accessor,&field_method,"\n}");
      std::__cxx11::string::append((string *)obj_api_class);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_method);
      std::__cxx11::string::~string((string *)&field_field);
      std::__cxx11::string::append((char *)obj_api_class);
      std::__cxx11::string::append((char *)&unpack_func);
      std::__cxx11::string::append((char *)&unpack_to_func);
      std::operator+(&field_method,&unpack_func,"\n\n");
      std::operator+(&field_accessor,&field_method,&unpack_to_func);
      std::__cxx11::string::operator=((string *)obj_api_unpack_func,(string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_method);
      std::__cxx11::string::~string((string *)&struct_name);
      std::__cxx11::string::~string((string *)&pack_func_create_call);
      std::__cxx11::string::~string((string *)&pack_func_offset_decl);
      std::__cxx11::string::~string((string *)&pack_func_prototype);
      std::__cxx11::string::~string((string *)&constructor_func);
      std::__cxx11::string::~string((string *)&unpack_to_func);
      std::__cxx11::string::~string((string *)&unpack_func);
      std::__cxx11::string::~string((string *)&class_name);
      return;
    }
    field = *ppFVar6;
    if (field->deprecated != false) goto LAB_001ccec7;
    (*(this_00->super_Namer)._vptr_Namer[4])(&field_method,this_00,field);
    (*(this_00->super_Namer)._vptr_Namer[0x12])(&field_field,this_00,field);
    std::operator+(&field_accessor,"this.",&field_method);
    std::operator+(&field_binded_method,&field_accessor,".bind(this)");
    std::__cxx11::string::~string((string *)&field_accessor);
    field_val._M_dataplus._M_p = (pointer)&field_val.field_2;
    field_val._M_string_length = 0;
    field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
    field_type._M_string_length = 0;
    field_offset_decl._M_dataplus._M_p = (pointer)&field_offset_decl.field_2;
    field_offset_decl._M_string_length = 0;
    field_val.field_2._M_local_buf[0] = '\0';
    field_type.field_2._M_local_buf[0] = '\0';
    field_offset_decl.field_2._M_local_buf[0] = '\0';
    field_offset_val._M_dataplus._M_p = (pointer)&field_offset_val.field_2;
    field_offset_val._M_string_length = 0;
    field_offset_val.field_2._M_local_buf[0] = '\0';
    GenDefaultValue(&field_default_val,this,field,imports);
    union_type = (EnumDef *)&field->value;
    BVar1 = (field->value).type.base_type;
    if (BVar1 - BASE_TYPE_UTYPE < 0xd) {
      bVar4 = true;
      if (BVar1 != BASE_TYPE_STRING) {
        bVar4 = HasNullDefault(field);
      }
      union_enum = (EnumDef *)0x0;
      GenTypeName(&field_accessor,this,imports,&field->super_Definition,(Type *)union_type,false,
                  bVar4);
      std::__cxx11::string::append((string *)&field_type);
      std::__cxx11::string::~string((string *)&field_accessor);
      (*(this_00->super_Namer)._vptr_Namer[4])(&vectortypename,this_00,field);
      __return_storage_ptr__ = &vectortype;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,"this.",&vectortypename);
      std::operator+(&field_accessor,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,"()");
      std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&vectortypename);
      if ((((Value *)union_type)->type).base_type == BASE_TYPE_STRING) {
        (*(this_00->super_Namer)._vptr_Namer[0x12])(&vectortypename,this_00,field);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vectortype,"this.",&vectortypename);
        std::operator+(&local_448,"builder.createString(this.",&field_field);
        std::operator+(&field_type_name,&local_448,"!)");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4e8,"0",(allocator<char> *)&local_4c8);
        GenNullCheckConditional(&field_accessor,(string *)&vectortype,&field_type_name,&local_4e8);
        std::__cxx11::string::operator=((string *)&field_offset_decl,(string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_accessor);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&field_type_name);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&vectortype);
        __return_storage_ptr__ = (Type *)&vectortypename;
      }
      else {
        (*(this_00->super_Namer)._vptr_Namer[0x12])(__return_storage_ptr__,this_00,field);
        std::operator+(&field_accessor,"this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__);
        std::__cxx11::string::operator=((string *)&field_offset_val,(string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_accessor);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      goto LAB_001cc8ba;
    }
    switch(BVar1) {
    case BASE_TYPE_VECTOR:
      BVar1 = (field->value).type.element;
      vectortype.struct_def = (field->value).type.struct_def;
      pIVar2 = (IDLOptions *)(field->value).type.enum_def;
      vectortype.fixed_length = (field->value).type.fixed_length;
      vectortype.element = BASE_TYPE_NONE;
      union_enum = (EnumDef *)0x0;
      vectortype.base_type = BVar1;
      vectortype.enum_def = (EnumDef *)pIVar2;
      GenTypeName(&vectortypename,this,imports,&struct_def->super_Definition,&vectortype,false,false
                 );
      std::__cxx11::string::assign((char *)&field_type);
      if (BVar1 == BASE_TYPE_STRING) {
        std::__cxx11::string::append((char *)&field_type);
        GenBBAccess_abi_cxx11_(&local_488,this);
        std::operator+(&local_4c8,&local_488,".createScalarList<string>(");
        std::operator+(&local_4e8,&local_4c8,&field_binded_method);
        std::operator+(&local_448,&local_4e8,", this.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"Length",(allocator<char> *)&local_428);
        IdlNamer::Field(&local_4a8,this_00,field,&local_468);
        std::operator+(&field_type_name,&local_448,&local_4a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor,&field_type_name,"())");
        std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_type_name);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_488);
        AddImport<flatbuffers::StructDef>
                  ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                   struct_def);
        std::operator+(&local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor,".");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"create",(allocator<char> *)&local_1b0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Vector",local_148);
        (*(this_00->super_Namer)._vptr_Namer[2])(&local_468,this_00,&local_428,field);
        std::operator+(&local_488,&local_4a8,&local_468);
        std::operator+(&local_4c8,&local_488,"(builder, builder.createObjectOffsetList(");
        std::operator+(&local_4e8,&local_4c8,"this.");
        (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_368,this_00,field);
        std::operator+(&local_448,&local_4e8,&local_368);
        std::operator+(&field_type_name,&local_448,"))");
        goto LAB_001cbf1a;
      }
      if (BVar1 != BASE_TYPE_STRUCT) {
        if (BVar1 == BASE_TYPE_UNION) {
          GenObjApiUnionTypeTS(&field_accessor,this,imports,struct_def,pIVar2,union_enum);
          std::__cxx11::string::append((string *)&field_type);
          std::__cxx11::string::~string((string *)&field_accessor);
          std::__cxx11::string::append((char *)&field_type);
          union_enum = (EnumDef *)&vectortype;
          GenUnionValTS(&field_accessor,this,imports,struct_def,&field_method,(Type *)union_enum,
                        true);
          std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
          std::__cxx11::string::~string((string *)&field_accessor);
          AddImport<flatbuffers::StructDef>
                    ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                     struct_def);
          std::operator+(&local_4a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_accessor,".");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"create",(allocator<char> *)&local_1b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"Vector",local_148);
          (*(this_00->super_Namer)._vptr_Namer[2])(&local_468,this_00,&local_428,field);
          std::operator+(&local_488,&local_4a8,&local_468);
          std::operator+(&local_4c8,&local_488,"(builder, builder.createObjectOffsetList(");
          std::operator+(&local_4e8,&local_4c8,"this.");
          (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_368,this_00,field);
          std::operator+(&local_448,&local_4e8,&local_368);
          std::operator+(&field_type_name,&local_448,"))");
          goto LAB_001cbf1a;
        }
        if (pIVar2 == (IDLOptions *)0x0) {
          std::__cxx11::string::append((string *)&field_type);
        }
        else {
          bVar4 = HasNullDefault(field);
          union_enum = (EnumDef *)0x0;
          GenTypeName(&field_accessor,this,imports,&struct_def->super_Definition,&vectortype,false,
                      bVar4);
          std::__cxx11::string::append((string *)&field_type);
          std::__cxx11::string::~string((string *)&field_accessor);
        }
        std::__cxx11::string::append((char *)&field_type);
        GenBBAccess_abi_cxx11_(&local_468,this);
        std::operator+(&local_4a8,&local_468,".createScalarList<");
        std::operator+(&local_488,&local_4a8,&vectortypename);
        std::operator+(&local_4c8,&local_488,">(");
        std::operator+(&local_4e8,&local_4c8,&field_binded_method);
        std::operator+(&local_448,&local_4e8,", this.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"Length",(allocator<char> *)&local_368);
        (*(this_00->super_Namer)._vptr_Namer[3])(&local_428,this_00,field,&local_3c8);
        std::operator+(&field_type_name,&local_448,&local_428);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor,&field_type_name,"())");
        std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_type_name);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_468);
        AddImport<flatbuffers::StructDef>
                  ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                   struct_def);
        std::operator+(&local_488,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor,".");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"create",(allocator<char> *)&local_3c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"Vector",(allocator<char> *)&local_368);
        (*(this_00->super_Namer)._vptr_Namer[2])(&local_4a8,this_00,&local_468,field);
        std::operator+(&local_4c8,&local_488,&local_4a8);
        std::operator+(&local_4e8,&local_4c8,"(builder, this.");
        std::operator+(&local_448,&local_4e8,&field_field);
        std::operator+(&field_type_name,&local_448,")");
LAB_001cc824:
        std::__cxx11::string::operator=((string *)&field_offset_decl,(string *)&field_type_name);
        std::__cxx11::string::~string((string *)&field_type_name);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_468);
        this_01 = &local_488;
        goto LAB_001cc887;
      }
      pSVar3 = (field->value).type.struct_def;
      GetTypeName_abi_cxx11_(&field_type_name,this,pSVar3,true,false);
      std::__cxx11::string::append((string *)&field_type);
      std::__cxx11::string::append((char *)&field_type);
      GenBBAccess_abi_cxx11_(&local_368,this);
      std::operator+(&local_3c8,&local_368,".createObjList<");
      std::operator+(&local_428,&local_3c8,&vectortypename);
      std::operator+(&local_468,&local_428,", ");
      std::operator+(&local_4a8,&local_468,&field_type_name);
      std::operator+(&local_488,&local_4a8,">(");
      std::operator+(&local_4c8,&local_488,&field_binded_method);
      std::operator+(&local_4e8,&local_4c8,", this.");
      std::__cxx11::string::string<std::allocator<char>>((string *)local_148,"Length",&local_321);
      (*(this_00->super_Namer)._vptr_Namer[3])(&local_1b0,this_00,field,(string *)local_148);
      std::operator+(&local_448,&local_4e8,&local_1b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &field_accessor,&local_448,"())");
      std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_368);
      if (pSVar3->fixed == true) {
        std::operator+(&local_468,"builder.createStructOffsetList(this.",&field_field);
        std::operator+(&local_4a8,&local_468,", ");
        AddImport<flatbuffers::StructDef>
                  ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                   struct_def);
        std::operator+(&local_488,&local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor);
        std::operator+(&local_4c8,&local_488,".");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"start",(allocator<char> *)&local_1b0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"Vector",local_148);
        (*(this_00->super_Namer)._vptr_Namer[2])(&local_428,this_00,&local_3c8,field);
        std::operator+(&local_4e8,&local_4c8,&local_428);
        std::operator+(&local_448,&local_4e8,")");
        goto LAB_001cb9b5;
      }
      AddImport<flatbuffers::StructDef>
                ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                 struct_def);
      std::operator+(&local_468,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &field_accessor,".");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"create",(allocator<char> *)&local_1b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"Vector",local_148);
      (*(this_00->super_Namer)._vptr_Namer[2])(&local_428,this_00,&local_3c8,field);
      std::operator+(&local_4a8,&local_468,&local_428);
      std::operator+(&local_488,&local_4a8,"(builder, builder.createObjectOffsetList(");
      std::operator+(&local_4c8,&local_488,"this.");
      std::operator+(&local_4e8,&local_4c8,&field_field);
      std::operator+(&local_448,&local_4e8,"))");
LAB_001cc279:
      std::__cxx11::string::operator=((string *)&field_offset_decl,(string *)&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_468);
      anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&field_accessor);
LAB_001cc2fe:
      std::__cxx11::string::~string((string *)&field_type_name);
      goto LAB_001cc899;
    case BASE_TYPE_STRUCT:
      pSVar3 = (field->value).type.struct_def;
      AddImport<flatbuffers::StructDef>
                ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                 pSVar3);
      std::__cxx11::string::append((string *)&field_type);
      anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&field_accessor);
      (*(this_00->super_Namer)._vptr_Namer[4])(&vectortypename,this_00,field);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype,"this.",&vectortypename);
      std::operator+(&field_accessor,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype,"()");
      std::__cxx11::string::~string((string *)&vectortype);
      std::__cxx11::string::~string((string *)&vectortypename);
      std::operator+(&vectortypename,&field_accessor,"!.unpack()");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&field_type_name,"null",(allocator<char> *)&local_448);
      GenNullCheckConditional
                ((string *)&vectortype,&field_accessor,&vectortypename,&field_type_name);
      std::__cxx11::string::operator=((string *)&field_val,(string *)&vectortype);
      std::__cxx11::string::~string((string *)&vectortype);
      std::__cxx11::string::~string((string *)&field_type_name);
      std::__cxx11::string::~string((string *)&vectortypename);
      std::operator+(&vectortypename,"this.",&field_field);
      std::operator+(&local_448,"this.",&field_field);
      std::operator+(&field_type_name,&local_448,"!.pack(builder)");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"0",(allocator<char> *)&local_4c8);
      GenNullCheckConditional((string *)&vectortype,&vectortypename,&field_type_name,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&field_type_name);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&vectortypename);
      psVar7 = &field_offset_decl;
      if (pSVar3->fixed != false) {
        psVar7 = &field_offset_val;
      }
      std::__cxx11::string::operator=((string *)psVar7,(string *)&vectortype);
      std::__cxx11::string::~string((string *)&vectortype);
      std::__cxx11::string::~string((string *)&field_accessor);
      break;
    case BASE_TYPE_UNION:
      GenObjApiUnionTypeTS
                (&field_accessor,this,imports,struct_def,(IDLOptions *)(field->value).type.enum_def,
                 union_enum);
      std::__cxx11::string::append((string *)&field_type);
      std::__cxx11::string::~string((string *)&field_accessor);
      GenUnionValTS(&field_accessor,this,imports,struct_def,&field_method,(Type *)union_type,false);
      std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype,"builder.createObjectOffset(this.",&field_field);
      std::operator+(&field_accessor,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype,")");
      std::__cxx11::string::operator=((string *)&field_offset_decl,(string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::__cxx11::string::~string((string *)&vectortype);
      union_enum = union_type;
      break;
    case BASE_TYPE_ARRAY:
      BVar1 = (field->value).type.element;
      vectortype.struct_def = (field->value).type.struct_def;
      pIVar2 = (IDLOptions *)(field->value).type.enum_def;
      vectortype.fixed_length = (field->value).type.fixed_length;
      vectortype.element = BASE_TYPE_NONE;
      union_enum = (EnumDef *)0x0;
      vectortype.base_type = BVar1;
      vectortype.enum_def = (EnumDef *)pIVar2;
      GenTypeName(&vectortypename,this,imports,&struct_def->super_Definition,&vectortype,false,false
                 );
      std::__cxx11::string::assign((char *)&field_type);
      if (BVar1 == BASE_TYPE_STRING) {
        std::__cxx11::string::append((char *)&field_type);
        GenBBAccess_abi_cxx11_(&local_488,this);
        std::operator+(&local_4c8,&local_488,".createScalarList<string>(");
        std::operator+(&local_4e8,&local_4c8,&field_binded_method);
        std::operator+(&local_448,&local_4e8,", this.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"Length",(allocator<char> *)&local_428);
        IdlNamer::Field(&local_4a8,this_00,field,&local_468);
        std::operator+(&field_type_name,&local_448,&local_4a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor,&field_type_name,"())");
        std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_type_name);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_488);
        AddImport<flatbuffers::StructDef>
                  ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                   struct_def);
        std::operator+(&local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor,".");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"create",(allocator<char> *)&local_1b0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Vector",local_148);
        (*(this_00->super_Namer)._vptr_Namer[2])(&local_468,this_00,&local_428,field);
        std::operator+(&local_488,&local_4a8,&local_468);
        std::operator+(&local_4c8,&local_488,"(builder, builder.createObjectOffsetList(");
        std::operator+(&local_4e8,&local_4c8,"this.");
        (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_368,this_00,field);
        std::operator+(&local_448,&local_4e8,&local_368);
        std::operator+(&field_type_name,&local_448,"))");
      }
      else {
        if (BVar1 == BASE_TYPE_STRUCT) {
          pSVar3 = (field->value).type.struct_def;
          GetTypeName_abi_cxx11_(&field_type_name,this,pSVar3,true,false);
          std::__cxx11::string::append((string *)&field_type);
          std::__cxx11::string::append((char *)&field_type);
          GenBBAccess_abi_cxx11_(&local_368,this);
          std::operator+(&local_3c8,&local_368,".createObjList<");
          std::operator+(&local_428,&local_3c8,&vectortypename);
          std::operator+(&local_468,&local_428,", ");
          std::operator+(&local_4a8,&local_468,&field_type_name);
          std::operator+(&local_488,&local_4a8,">(");
          std::operator+(&local_4c8,&local_488,&field_binded_method);
          std::operator+(&local_4e8,&local_4c8,", ");
          NumToString<unsigned_short>(&local_1b0,(field->value).type.fixed_length);
          std::operator+(&local_448,&local_4e8,&local_1b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_accessor,&local_448,")");
          std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
          std::__cxx11::string::~string((string *)&field_accessor);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_368);
          if (pSVar3->fixed != true) {
            AddImport<flatbuffers::StructDef>
                      ((ImportDefinition *)&field_accessor,this,imports,
                       &struct_def->super_Definition,struct_def);
            std::operator+(&local_468,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &field_accessor,".");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3c8,"create",(allocator<char> *)&local_1b0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_368,"Vector",local_148);
            (*(this_00->super_Namer)._vptr_Namer[2])(&local_428,this_00,&local_3c8,field);
            std::operator+(&local_4a8,&local_468,&local_428);
            std::operator+(&local_488,&local_4a8,"(builder, builder.createObjectOffsetList(");
            std::operator+(&local_4c8,&local_488,"this.");
            std::operator+(&local_4e8,&local_4c8,&field_field);
            std::operator+(&local_448,&local_4e8,"))");
            goto LAB_001cc279;
          }
          std::operator+(&local_468,"builder.createStructOffsetList(this.",&field_field);
          std::operator+(&local_4a8,&local_468,", ");
          AddImport<flatbuffers::StructDef>
                    ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                     struct_def);
          std::operator+(&local_488,&local_4a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_accessor);
          std::operator+(&local_4c8,&local_488,".");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"start",(allocator<char> *)&local_1b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,"Vector",local_148);
          (*(this_00->super_Namer)._vptr_Namer[2])(&local_428,this_00,&local_3c8,field);
          std::operator+(&local_4e8,&local_4c8,&local_428);
          std::operator+(&local_448,&local_4e8,")");
LAB_001cb9b5:
          std::__cxx11::string::operator=((string *)&field_offset_decl,(string *)&local_448);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_488);
          anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&field_accessor);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_468);
          goto LAB_001cc2fe;
        }
        if (BVar1 != BASE_TYPE_UNION) {
          if (pIVar2 == (IDLOptions *)0x0) {
            std::__cxx11::string::append((string *)&field_type);
          }
          else {
            bVar4 = HasNullDefault(field);
            union_enum = (EnumDef *)0x0;
            GenTypeName(&field_accessor,this,imports,&struct_def->super_Definition,&vectortype,false
                        ,bVar4);
            std::__cxx11::string::append((string *)&field_type);
            std::__cxx11::string::~string((string *)&field_accessor);
          }
          std::__cxx11::string::append((char *)&field_type);
          GenBBAccess_abi_cxx11_(&local_468,this);
          std::operator+(&local_4a8,&local_468,".createScalarList<");
          std::operator+(&local_488,&local_4a8,&vectortypename);
          std::operator+(&local_4c8,&local_488,">(");
          std::operator+(&local_4e8,&local_4c8,&field_binded_method);
          std::operator+(&local_448,&local_4e8,", ");
          NumToString<unsigned_short>(&local_428,(field->value).type.fixed_length);
          std::operator+(&field_type_name,&local_448,&local_428);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_accessor,&field_type_name,")");
          std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
          std::__cxx11::string::~string((string *)&field_accessor);
          std::__cxx11::string::~string((string *)&field_type_name);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_468);
          AddImport<flatbuffers::StructDef>
                    ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                     struct_def);
          std::operator+(&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_accessor,".");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_468,"create",(allocator<char> *)&local_3c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"Vector",(allocator<char> *)&local_368);
          (*(this_00->super_Namer)._vptr_Namer[2])(&local_4a8,this_00,&local_468,field);
          std::operator+(&local_4c8,&local_488,&local_4a8);
          std::operator+(&local_4e8,&local_4c8,"(builder, this.");
          std::operator+(&local_448,&local_4e8,&field_field);
          std::operator+(&field_type_name,&local_448,")");
          goto LAB_001cc824;
        }
        GenObjApiUnionTypeTS(&field_accessor,this,imports,struct_def,pIVar2,union_enum);
        std::__cxx11::string::append((string *)&field_type);
        std::__cxx11::string::~string((string *)&field_accessor);
        std::__cxx11::string::append((char *)&field_type);
        union_enum = (EnumDef *)&vectortype;
        GenUnionValTS(&field_accessor,this,imports,struct_def,&field_method,(Type *)union_enum,true)
        ;
        std::__cxx11::string::operator=((string *)&field_val,(string *)&field_accessor);
        std::__cxx11::string::~string((string *)&field_accessor);
        AddImport<flatbuffers::StructDef>
                  ((ImportDefinition *)&field_accessor,this,imports,&struct_def->super_Definition,
                   struct_def);
        std::operator+(&local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_accessor,".");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"create",(allocator<char> *)&local_1b0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Vector",local_148);
        (*(this_00->super_Namer)._vptr_Namer[2])(&local_468,this_00,&local_428,field);
        std::operator+(&local_488,&local_4a8,&local_468);
        std::operator+(&local_4c8,&local_488,"(builder, builder.createObjectOffsetList(");
        std::operator+(&local_4e8,&local_4c8,"this.");
        (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_368,this_00,field);
        std::operator+(&local_448,&local_4e8,&local_368);
        std::operator+(&field_type_name,&local_448,"))");
      }
LAB_001cbf1a:
      std::__cxx11::string::operator=((string *)&field_offset_decl,(string *)&field_type_name);
      std::__cxx11::string::~string((string *)&field_type_name);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_428);
      this_01 = &local_4a8;
LAB_001cc887:
      std::__cxx11::string::~string((string *)this_01);
      anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&field_accessor);
LAB_001cc899:
      std::__cxx11::string::~string((string *)&vectortypename);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                    ,0x5ac,
                    "void flatbuffers::ts::TsGenerator::GenObjApi(const Parser &, StructDef &, std::string &, std::string &, import_set &)"
                   );
    }
    std::__cxx11::string::append((char *)&field_type);
LAB_001cc8ba:
    if (field_offset_decl._M_string_length != 0) {
      std::operator+(&field_type_name,"  const ",&field_field);
      std::operator+(&vectortypename,&field_type_name," = ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype,&vectortypename,&field_offset_decl);
      std::operator+(&field_accessor,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype,";");
      std::__cxx11::string::operator=((string *)&field_offset_decl,(string *)&field_accessor);
      std::__cxx11::string::~string((string *)&field_accessor);
      std::__cxx11::string::~string((string *)&vectortype);
      std::__cxx11::string::~string((string *)&vectortypename);
      std::__cxx11::string::~string((string *)&field_type_name);
    }
    if (field_offset_val._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&field_offset_val);
    }
    std::operator+(&field_accessor,"    ",&field_val);
    std::__cxx11::string::append((string *)&unpack_func);
    std::__cxx11::string::~string((string *)&field_accessor);
    std::operator+(&field_type_name,"  _o.",&field_field);
    std::operator+(&vectortypename,&field_type_name," = ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vectortype,
                   &vectortypename,&field_val);
    std::operator+(&field_accessor,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vectortype,
                   ";");
    std::__cxx11::string::append((string *)&unpack_to_func);
    std::__cxx11::string::~string((string *)&field_accessor);
    std::__cxx11::string::~string((string *)&vectortype);
    std::__cxx11::string::~string((string *)&vectortypename);
    std::__cxx11::string::~string((string *)&field_type_name);
    std::operator+(&local_448,"  public ",&field_field);
    std::operator+(&field_type_name,&local_448,": ");
    std::operator+(&vectortypename,&field_type_name,&field_type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vectortype,
                   &vectortypename," = ");
    std::operator+(&field_accessor,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vectortype,
                   &field_default_val);
    std::__cxx11::string::append((string *)&constructor_func);
    std::__cxx11::string::~string((string *)&field_accessor);
    std::__cxx11::string::~string((string *)&vectortype);
    std::__cxx11::string::~string((string *)&vectortypename);
    std::__cxx11::string::~string((string *)&field_type_name);
    std::__cxx11::string::~string((string *)&local_448);
    if (struct_def->fixed == false) {
      if (field_offset_decl._M_string_length != 0) {
        std::operator+(&field_accessor,&field_offset_decl,"\n");
        std::__cxx11::string::append((string *)&pack_func_offset_decl);
        std::__cxx11::string::~string((string *)&field_accessor);
      }
      if (local_511 == false) {
        if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
           (field->presence == kOptional)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vectortype,"  if (",&field_offset_val);
          std::operator+(&field_accessor,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vectortype," !== null)\n  ");
          std::__cxx11::string::append((string *)&pack_func_create_call);
          std::__cxx11::string::~string((string *)&field_accessor);
          std::__cxx11::string::~string((string *)&vectortype);
        }
        std::operator+(&local_4e8,"  ",&struct_name);
        std::operator+(&local_448,&local_4e8,".");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_488,"add",(allocator<char> *)&local_4a8);
        (*(this_00->super_Namer)._vptr_Namer[3])(&local_4c8,this_00,&local_488,field);
        std::operator+(&field_type_name,&local_448,&local_4c8);
        std::operator+(&vectortypename,&field_type_name,"(builder, ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vectortype,&vectortypename,&field_offset_val);
        std::operator+(&field_accessor,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vectortype,");\n");
        std::__cxx11::string::append((string *)&pack_func_create_call);
        std::__cxx11::string::~string((string *)&field_accessor);
        std::__cxx11::string::~string((string *)&vectortype);
        std::__cxx11::string::~string((string *)&vectortypename);
        std::__cxx11::string::~string((string *)&field_type_name);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_4e8);
      }
      else {
        std::__cxx11::string::append((string *)&pack_func_create_call);
      }
    }
    if (ppFVar6 + 1 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&constructor_func);
      if (struct_def->fixed == false) {
        std::__cxx11::string::append((char *)&pack_func_offset_decl);
        std::__cxx11::string::append((char *)&pack_func_create_call);
      }
    }
    else {
      std::__cxx11::string::append((char *)&constructor_func);
      if (struct_def->fixed == false && local_511 == true) {
        std::__cxx11::string::append((char *)&pack_func_create_call);
      }
    }
    std::__cxx11::string::append((char *)&unpack_func);
    std::__cxx11::string::append((char *)&unpack_to_func);
    std::__cxx11::string::~string((string *)&field_default_val);
    std::__cxx11::string::~string((string *)&field_offset_val);
    std::__cxx11::string::~string((string *)&field_offset_decl);
    std::__cxx11::string::~string((string *)&field_type);
    std::__cxx11::string::~string((string *)&field_val);
    std::__cxx11::string::~string((string *)&field_binded_method);
    std::__cxx11::string::~string((string *)&field_field);
    std::__cxx11::string::~string((string *)&field_method);
LAB_001ccec7:
    ppFVar6 = ppFVar6 + 1;
  } while( true );
}

Assistant:

void GenObjApi(const Parser &parser, StructDef &struct_def,
                 std::string &obj_api_unpack_func, std::string &obj_api_class,
                 import_set &imports) {
    const auto class_name = GetTypeName(struct_def, /*object_api=*/true);

    std::string unpack_func = "\nunpack(): " + class_name +
                              " {\n  return new " + class_name + "(" +
                              (struct_def.fields.vec.empty() ? "" : "\n");
    std::string unpack_to_func = "\nunpackTo(_o: " + class_name + "): void {" +
                                 +(struct_def.fields.vec.empty() ? "" : "\n");

    std::string constructor_func = "constructor(";
    constructor_func += (struct_def.fields.vec.empty() ? "" : "\n");

    const auto has_create =
        struct_def.fixed || CanCreateFactoryMethod(struct_def);

    std::string pack_func_prototype =
        "\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n";

    std::string pack_func_offset_decl;
    std::string pack_func_create_call;

    const auto struct_name = AddImport(imports, struct_def, struct_def).name;

    if (has_create) {
      pack_func_create_call = "  return " + struct_name + ".create" +
                              GetPrefixedName(struct_def) + "(builder" +
                              (struct_def.fields.vec.empty() ? "" : ",\n    ");
    } else {
      pack_func_create_call = "  " + struct_name + ".start" +
                              GetPrefixedName(struct_def) + "(builder);\n";
    }

    if (struct_def.fixed) {
      // when packing struct, nested struct's members instead of the struct's
      // offset are used
      pack_func_create_call +=
          GenStructMemberValueTS(struct_def, "this", ",\n    ", false) + "\n  ";
    }

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      const auto field_method = namer_.Method(field);
      const auto field_field = namer_.Field(field);
      const std::string field_binded_method =
          "this." + field_method + ".bind(this)";

      std::string field_val;
      std::string field_type;
      // a string that declares a variable containing the
      // offset for things that can't be generated inline
      // empty otw
      std::string field_offset_decl;
      // a string that contains values for things that can be created inline or
      // the variable name from field_offset_decl
      std::string field_offset_val;
      const auto field_default_val = GenDefaultValue(field, imports);

      // Emit a scalar field
      const auto is_string = IsString(field.value.type);
      if (IsScalar(field.value.type.base_type) || is_string) {
        const auto has_null_default = is_string || HasNullDefault(field);

        field_type += GenTypeName(imports, field, field.value.type, false,
                                  has_null_default);
        field_val = "this." + namer_.Method(field) + "()";

        if (field.value.type.base_type != BASE_TYPE_STRING) {
          field_offset_val = "this." + namer_.Field(field);
        } else {
          field_offset_decl = GenNullCheckConditional(
              "this." + namer_.Field(field),
              "builder.createString(this." + field_field + "!)", "0");
        }
      }

      // Emit an object field
      else {
        auto is_vector = false;
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            const auto &sd = *field.value.type.struct_def;
            field_type += AddImport(imports, struct_def, sd).object_name;

            const std::string field_accessor =
                "this." + namer_.Method(field) + "()";
            field_val = GenNullCheckConditional(field_accessor,
                                                field_accessor + "!.unpack()");
            auto packing = GenNullCheckConditional(
                "this." + field_field,
                "this." + field_field + "!.pack(builder)", "0");

            if (sd.fixed) {
              field_offset_val = std::move(packing);
            } else {
              field_offset_decl = std::move(packing);
            }

            break;
          }

          case BASE_TYPE_ARRAY: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_VECTOR: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", this." +
                            namer_.Method(field, "Length") + "())";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method +
                            ", this." + namer_.Method(field, "Length") + "())";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_UNION: {
            field_type += GenObjApiUnionTypeTS(imports, struct_def, parser.opts,
                                               *(field.value.type.enum_def));

            field_val = GenUnionValTS(imports, struct_def, field_method,
                                      field.value.type);
            field_offset_decl =
                "builder.createObjectOffset(this." + field_field + ")";
            break;
          }

          default: FLATBUFFERS_ASSERT(0); break;
        }

        // length 0 vector is simply empty instead of null
        field_type += is_vector ? "" : "|null";
      }

      if (!field_offset_decl.empty()) {
        field_offset_decl =
            "  const " + field_field + " = " + field_offset_decl + ";";
      }
      if (field_offset_val.empty()) { field_offset_val = field_field; }

      unpack_func += "    " + field_val;
      unpack_to_func += "  _o." + field_field + " = " + field_val + ";";

      // FIXME: if field_type and field_field are identical, then
      // this generates invalid typescript.
      constructor_func += "  public " + field_field + ": " + field_type +
                          " = " + field_default_val;

      if (!struct_def.fixed) {
        if (!field_offset_decl.empty()) {
          pack_func_offset_decl += field_offset_decl + "\n";
        }

        if (has_create) {
          pack_func_create_call += field_offset_val;
        } else {
          if (field.IsScalarOptional()) {
            pack_func_create_call +=
                "  if (" + field_offset_val + " !== null)\n  ";
          }
          pack_func_create_call += "  " + struct_name + "." +
                                   namer_.Method("add", field) + "(builder, " +
                                   field_offset_val + ");\n";
        }
      }

      if (std::next(it) != struct_def.fields.vec.end()) {
        constructor_func += ",\n";

        if (!struct_def.fixed && has_create) {
          pack_func_create_call += ",\n    ";
        }

        unpack_func += ",\n";
        unpack_to_func += "\n";
      } else {
        constructor_func += "\n";
        if (!struct_def.fixed) {
          pack_func_offset_decl += (pack_func_offset_decl.empty() ? "" : "\n");
          pack_func_create_call += "\n  ";
        }

        unpack_func += "\n  ";
        unpack_to_func += "\n";
      }
    }

    constructor_func += "){}\n\n";

    if (has_create) {
      pack_func_create_call += ");";
    } else {
      pack_func_create_call += "return " + struct_name + ".end" +
                               GetPrefixedName(struct_def) + "(builder);";
    }
    obj_api_class = "\n";
    obj_api_class += "export class ";
    obj_api_class += GetTypeName(struct_def, /*object_api=*/true);
    obj_api_class += " implements flatbuffers.IGeneratedObject {\n";
    obj_api_class += constructor_func;
    obj_api_class += pack_func_prototype + pack_func_offset_decl +
                     pack_func_create_call + "\n}";

    obj_api_class += "\n}\n";

    unpack_func += ");\n}";
    unpack_to_func += "}\n";

    obj_api_unpack_func = unpack_func + "\n\n" + unpack_to_func;
  }